

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int cmocka_run_one_test_or_fixture
              (char *function_name,CMUnitTestFunction test_func,CMFixtureFunction setup_func,
              CMFixtureFunction teardown_func,void **state,void *heap_check_point)

{
  undefined4 *puVar1;
  int iVar2;
  __sighandler_t p_Var3;
  SignalFunction *pp_Var4;
  char *test_name;
  ListNode *pLVar5;
  long lVar6;
  long *in_FS_OFFSET;
  void **state_local;
  ListNode *check_point;
  void *current_state;
  long local_38;
  
  local_38 = in_FS_OFFSET[5];
  test_name = function_name;
  if (heap_check_point == (void *)0x0) {
    heap_check_point = check_point_allocated_blocks();
  }
  current_state = (void *)0x0;
  pp_Var4 = default_signal_functions;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    test_name = (char *)(ulong)*(uint *)((long)exception_signals + lVar6);
    p_Var3 = signal(*(uint *)((long)exception_signals + lVar6),exception_handler);
    *pp_Var4 = (SignalFunction)p_Var3;
    pp_Var4 = pp_Var4 + 1;
  }
  initialize_testing(test_name);
  lVar6 = *in_FS_OFFSET;
  puVar1 = (undefined4 *)(lVar6 + -0x108);
  *puVar1 = 1;
  pLVar5 = (ListNode *)(lVar6 + -0x100);
  iVar2 = __sigsetjmp(pLVar5,1);
  if (iVar2 != 0) {
    iVar2 = -1;
    heap_check_point = pLVar5;
    goto LAB_0011edee;
  }
  if (test_func == (CMUnitTestFunction)0x0) {
    if (setup_func == (CMFixtureFunction)0x0) {
      if (teardown_func == (CMFixtureFunction)0x0) goto LAB_0011eda8;
      if (state == (void **)0x0) {
        state = &current_state;
      }
      iVar2 = (*teardown_func)(state);
      fail_if_blocks_allocated((ListNode *)heap_check_point,function_name);
    }
    else {
      heap_check_point = state;
      if (state == (void **)0x0) {
        heap_check_point = &current_state;
      }
      iVar2 = (*setup_func)((void **)heap_check_point);
    }
  }
  else {
    if (state == (void **)0x0) {
      state = &current_state;
    }
    (*test_func)(state);
    fail_if_blocks_allocated((ListNode *)heap_check_point,function_name);
    pLVar5 = (ListNode *)heap_check_point;
LAB_0011eda8:
    heap_check_point = pLVar5;
    iVar2 = 0;
  }
  fail_if_leftover_values((char *)heap_check_point);
LAB_0011edee:
  *puVar1 = 0;
  teardown_testing((char *)heap_check_point);
  pp_Var4 = default_signal_functions;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    signal(*(int *)((long)exception_signals + lVar6),(__sighandler_t)*pp_Var4);
    pp_Var4 = pp_Var4 + 1;
  }
  if (in_FS_OFFSET[5] != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int cmocka_run_one_test_or_fixture(const char *function_name,
                                          CMUnitTestFunction test_func,
                                          CMFixtureFunction setup_func,
                                          CMFixtureFunction teardown_func,
                                          void ** const volatile state,
                                          const void *const heap_check_point)
{
    const ListNode * const volatile check_point = (const ListNode*)
        (heap_check_point != NULL ?
         heap_check_point : check_point_allocated_blocks());
    int handle_exceptions = 1;
    void *current_state = NULL;
    int rc = 0;

    /* FIXME check only one test or fixture is set */

    /* Detect if we should handle exceptions */
#ifdef _WIN32
    handle_exceptions = !IsDebuggerPresent();
#endif /* _WIN32 */
#ifdef UNIT_TESTING_DEBUG
    handle_exceptions = 0;
#endif /* UNIT_TESTING_DEBUG */


    if (handle_exceptions) {
#ifndef _WIN32
        unsigned int i;
        for (i = 0; i < ARRAY_SIZE(exception_signals); i++) {
            default_signal_functions[i] = signal(
                    exception_signals[i], exception_handler);
        }
#else /* _WIN32 */
        previous_exception_filter = SetUnhandledExceptionFilter(
                exception_filter);
#endif /* !_WIN32 */
    }

    /* Init the test structure */
    initialize_testing(function_name);

    global_running_test = 1;

    if (cm_setjmp(global_run_test_env) == 0) {
        if (test_func != NULL) {
            test_func(state != NULL ? state : &current_state);

            fail_if_blocks_allocated(check_point, function_name);
            rc = 0;
        } else if (setup_func != NULL) {
            rc = setup_func(state != NULL ? state : &current_state);

            /*
             * For setup we can ignore any allocated blocks. We just need to
             * ensure they're deallocated on tear down.
             */
        } else if (teardown_func != NULL) {
            rc = teardown_func(state != NULL ? state : &current_state);

            fail_if_blocks_allocated(check_point, function_name);
        } else {
            /* ERROR */
        }
        fail_if_leftover_values(function_name);
        global_running_test = 0;
    } else {
        /* TEST FAILED */
        global_running_test = 0;
        rc = -1;
    }
    teardown_testing(function_name);

    if (handle_exceptions) {
#ifndef _WIN32
        unsigned int i;
        for (i = 0; i < ARRAY_SIZE(exception_signals); i++) {
            signal(exception_signals[i], default_signal_functions[i]);
        }
#else /* _WIN32 */
        if (previous_exception_filter) {
            SetUnhandledExceptionFilter(previous_exception_filter);
            previous_exception_filter = NULL;
        }
#endif /* !_WIN32 */
    }

    return rc;
}